

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_vmask_sse4.c
# Opt level: O1

void aom_blend_a64_vmask_sse4_1
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,int w,int h)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  undefined1 in_XMM0 [16];
  undefined1 auVar11 [16];
  short sVar12;
  short sVar14;
  undefined1 auVar13 [16];
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 in_XMM4 [16];
  short sVar23;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  undefined1 in_XMM5 [16];
  undefined1 auVar24 [16];
  short sVar31;
  undefined1 in_XMM6 [16];
  undefined1 auVar32 [16];
  
  switch(w & 0xf) {
  case 0:
    auVar11 = pmovsxbw(in_XMM0,0x4040404040404040);
    do {
      if (0 < w) {
        auVar13 = pshuflw(ZEXT116(*mask),ZEXT116(*mask),0);
        sVar12 = auVar13._0_2_;
        sVar15 = auVar11._0_2_ - sVar12;
        sVar14 = auVar13._2_2_;
        sVar16 = auVar11._2_2_ - sVar14;
        sVar17 = auVar11._4_2_ - sVar12;
        sVar18 = auVar11._6_2_ - sVar14;
        sVar19 = auVar11._8_2_ - sVar12;
        sVar20 = auVar11._10_2_ - sVar14;
        sVar21 = auVar11._12_2_ - sVar12;
        sVar22 = auVar11._14_2_ - sVar14;
        lVar9 = 0;
        do {
          auVar13 = pmovzxbw(in_XMM4,*(undefined8 *)(src0 + lVar9));
          auVar24 = pmovzxbw(in_XMM5,*(undefined8 *)(src1 + lVar9));
          auVar32._0_2_ = auVar13._0_2_ * sVar12;
          auVar32._2_2_ = auVar13._2_2_ * sVar14;
          auVar32._4_2_ = auVar13._4_2_ * sVar12;
          auVar32._6_2_ = auVar13._6_2_ * sVar14;
          auVar32._8_2_ = auVar13._8_2_ * sVar12;
          auVar32._10_2_ = auVar13._10_2_ * sVar14;
          auVar32._12_2_ = auVar13._12_2_ * sVar12;
          auVar32._14_2_ = auVar13._14_2_ * sVar14;
          auVar13 = pmovzxbw(auVar32,*(undefined8 *)(src0 + lVar9 + 8));
          sVar23 = pavgw((ushort)(auVar24._0_2_ * sVar15 + auVar32._0_2_) >> 5,0);
          sVar25 = pavgw((ushort)(auVar24._2_2_ * sVar16 + auVar32._2_2_) >> 5,0);
          sVar26 = pavgw((ushort)(auVar24._4_2_ * sVar17 + auVar32._4_2_) >> 5,0);
          sVar27 = pavgw((ushort)(auVar24._6_2_ * sVar18 + auVar32._6_2_) >> 5,0);
          sVar28 = pavgw((ushort)(auVar24._8_2_ * sVar19 + auVar32._8_2_) >> 5,0);
          sVar29 = pavgw((ushort)(auVar24._10_2_ * sVar20 + auVar32._10_2_) >> 5,0);
          sVar30 = pavgw((ushort)(auVar24._12_2_ * sVar21 + auVar32._12_2_) >> 5,0);
          sVar31 = pavgw((ushort)(auVar24._14_2_ * sVar22 + auVar32._14_2_) >> 5,0);
          auVar32 = pmovzxbw(in_XMM6,*(undefined8 *)(src1 + lVar9 + 8));
          in_XMM4._0_2_ = auVar13._0_2_ * sVar12;
          in_XMM4._2_2_ = auVar13._2_2_ * sVar14;
          in_XMM4._4_2_ = auVar13._4_2_ * sVar12;
          in_XMM4._6_2_ = auVar13._6_2_ * sVar14;
          in_XMM4._8_2_ = auVar13._8_2_ * sVar12;
          in_XMM4._10_2_ = auVar13._10_2_ * sVar14;
          in_XMM4._12_2_ = auVar13._12_2_ * sVar12;
          in_XMM4._14_2_ = auVar13._14_2_ * sVar14;
          in_XMM6._0_2_ = pavgw((ushort)(auVar32._0_2_ * sVar15 + in_XMM4._0_2_) >> 5,0);
          in_XMM6._2_2_ = pavgw((ushort)(auVar32._2_2_ * sVar16 + in_XMM4._2_2_) >> 5,0);
          in_XMM6._4_2_ = pavgw((ushort)(auVar32._4_2_ * sVar17 + in_XMM4._4_2_) >> 5,0);
          in_XMM6._6_2_ = pavgw((ushort)(auVar32._6_2_ * sVar18 + in_XMM4._6_2_) >> 5,0);
          in_XMM6._8_2_ = pavgw((ushort)(auVar32._8_2_ * sVar19 + in_XMM4._8_2_) >> 5,0);
          in_XMM6._10_2_ = pavgw((ushort)(auVar32._10_2_ * sVar20 + in_XMM4._10_2_) >> 5,0);
          in_XMM6._12_2_ = pavgw((ushort)(auVar32._12_2_ * sVar21 + in_XMM4._12_2_) >> 5,0);
          in_XMM6._14_2_ = pavgw((ushort)(auVar32._14_2_ * sVar22 + in_XMM4._14_2_) >> 5,0);
          in_XMM5[1] = (0 < sVar25) * (sVar25 < 0x100) * (char)sVar25 - (0xff < sVar25);
          in_XMM5[0] = (0 < sVar23) * (sVar23 < 0x100) * (char)sVar23 - (0xff < sVar23);
          in_XMM5[2] = (0 < sVar26) * (sVar26 < 0x100) * (char)sVar26 - (0xff < sVar26);
          in_XMM5[3] = (0 < sVar27) * (sVar27 < 0x100) * (char)sVar27 - (0xff < sVar27);
          in_XMM5[4] = (0 < sVar28) * (sVar28 < 0x100) * (char)sVar28 - (0xff < sVar28);
          in_XMM5[5] = (0 < sVar29) * (sVar29 < 0x100) * (char)sVar29 - (0xff < sVar29);
          in_XMM5[6] = (0 < sVar30) * (sVar30 < 0x100) * (char)sVar30 - (0xff < sVar30);
          in_XMM5[7] = (0 < sVar31) * (sVar31 < 0x100) * (char)sVar31 - (0xff < sVar31);
          in_XMM5[8] = (0 < in_XMM6._0_2_) * (in_XMM6._0_2_ < 0x100) * (char)in_XMM6._0_2_ -
                       (0xff < in_XMM6._0_2_);
          in_XMM5[9] = (0 < in_XMM6._2_2_) * (in_XMM6._2_2_ < 0x100) * (char)in_XMM6._2_2_ -
                       (0xff < in_XMM6._2_2_);
          in_XMM5[10] = (0 < in_XMM6._4_2_) * (in_XMM6._4_2_ < 0x100) * (char)in_XMM6._4_2_ -
                        (0xff < in_XMM6._4_2_);
          in_XMM5[0xb] = (0 < in_XMM6._6_2_) * (in_XMM6._6_2_ < 0x100) * (char)in_XMM6._6_2_ -
                         (0xff < in_XMM6._6_2_);
          in_XMM5[0xc] = (0 < in_XMM6._8_2_) * (in_XMM6._8_2_ < 0x100) * (char)in_XMM6._8_2_ -
                         (0xff < in_XMM6._8_2_);
          in_XMM5[0xd] = (0 < in_XMM6._10_2_) * (in_XMM6._10_2_ < 0x100) * (char)in_XMM6._10_2_ -
                         (0xff < in_XMM6._10_2_);
          in_XMM5[0xe] = (0 < in_XMM6._12_2_) * (in_XMM6._12_2_ < 0x100) * (char)in_XMM6._12_2_ -
                         (0xff < in_XMM6._12_2_);
          in_XMM5[0xf] = (0 < in_XMM6._14_2_) * (in_XMM6._14_2_ < 0x100) * (char)in_XMM6._14_2_ -
                         (0xff < in_XMM6._14_2_);
          *(undefined1 (*) [16])(dst + lVar9) = in_XMM5;
          lVar9 = lVar9 + 0x10;
        } while (lVar9 < w);
      }
      dst = dst + dst_stride;
      src0 = src0 + src0_stride;
      src1 = src1 + src1_stride;
      mask = mask + 1;
      h = h + -1;
    } while (h != 0);
    return;
  default:
    if (0 < h) {
      uVar8 = 0;
      uVar6 = 0;
      uVar5 = 0;
      uVar7 = 0;
      do {
        if (0 < w) {
          bVar1 = mask[uVar7];
          uVar3 = (ulong)(uint)w;
          uVar2 = uVar8;
          uVar4 = uVar6;
          uVar10 = uVar5;
          do {
            dst[uVar10] = (uint8_t)((uint)src0[uVar2] * (uint)bVar1 +
                                    (uint)src1[uVar4] * (0x40 - (uint)bVar1) + 0x20 >> 6);
            uVar10 = uVar10 + 1;
            uVar4 = uVar4 + 1;
            uVar2 = uVar2 + 1;
            uVar3 = uVar3 - 1;
          } while (uVar3 != 0);
        }
        uVar7 = uVar7 + 1;
        uVar5 = uVar5 + dst_stride;
        uVar6 = uVar6 + src1_stride;
        uVar8 = uVar8 + src0_stride;
      } while (uVar7 != (uint)h);
    }
  }
  return;
}

Assistant:

void aom_blend_a64_vmask_sse4_1(uint8_t *dst, uint32_t dst_stride,
                                const uint8_t *src0, uint32_t src0_stride,
                                const uint8_t *src1, uint32_t src1_stride,
                                const uint8_t *mask, int w, int h) {
  typedef void (*blend_fn)(uint8_t * dst, uint32_t dst_stride,
                           const uint8_t *src0, uint32_t src0_stride,
                           const uint8_t *src1, uint32_t src1_stride,
                           const uint8_t *mask, int w, int h);

  // Dimension: width_index
  static const blend_fn blend[9] = {
    blend_a64_vmask_w16n_sse4_1,  // w % 16 == 0
    aom_blend_a64_vmask_c,        // w == 1
    aom_blend_a64_vmask_c,        // w == 2
    NULL,                         // INVALID
    blend_a64_vmask_w4_sse4_1,    // w == 4
    NULL,                         // INVALID
    NULL,                         // INVALID
    NULL,                         // INVALID
    blend_a64_vmask_w8_sse4_1,    // w == 8
  };

  assert(IMPLIES(src0 == dst, src0_stride == dst_stride));
  assert(IMPLIES(src1 == dst, src1_stride == dst_stride));

  assert(h >= 1);
  assert(w >= 1);
  assert(IS_POWER_OF_TWO(h));
  assert(IS_POWER_OF_TWO(w));

  blend[w & 0xf](dst, dst_stride, src0, src0_stride, src1, src1_stride, mask, w,
                 h);
}